

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::report_query(ConsoleReporter *this,QueryData *in)

{
  ContextOptions *pCVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  
  pCVar1 = this->opt;
  if (pCVar1->version == true) {
    printVersion((ConsoleReporter *)this->s);
    return;
  }
  if (pCVar1->help == true) {
    printVersion((ConsoleReporter *)this->s);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest]\n",10);
    Color::operator<<(poVar3,None);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"boolean values: \"1/on/yes/true\" or \"0/off/no/false\"\n",0x34);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"filter  values: \"str1,str2,str3\" (comma separated strings)\n",0x3b);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest]\n",10);
    Color::operator<<(poVar3,None);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"filters use wildcards for matching strings\n",0x2b);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"something passes a filter if any of the strings in a filter matches\n",0x44)
    ;
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest]\n",10);
    Color::operator<<(poVar3,None);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"dt-\" PREFIX!!!\n",
               0x45);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest]\n",10);
    Color::operator<<(poVar3,None);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"Query flags - the program quits after them. Available:\n\n",0x38);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -?,   --help, -h                      ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"prints this message\n",0x14);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -v,   --version                       ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"prints the version\n",0x13);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -c,   --count                         ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"prints the number of matching tests\n",0x24);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -ltc, --list-test-cases               ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"lists all matching tests by name\n",0x21);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -lts, --list-test-suites              ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"lists all matching test suites\n",0x1f);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -lr,  --list-reporters                ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"lists all registered reporters\n\n",0x20);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"The available <int>/<string> options/filters are:\n\n",0x33);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -tc,  --test-case=<filters>           ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters     tests by their name\n",0x20);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -tce, --test-case-exclude=<filters>   ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters OUT tests by their name\n",0x20);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -sf,  --source-file=<filters>         ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters     tests by their file\n",0x20);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -sfe, --source-file-exclude=<filters> ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters OUT tests by their file\n",0x20);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -ts,  --test-suite=<filters>          ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters     tests by their test suite\n",0x26);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -tse, --test-suite-exclude=<filters>  ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters OUT tests by their test suite\n",0x26);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -sc,  --subcase=<filters>             ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters     subcases by their name\n",0x23);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -sce, --subcase-exclude=<filters>     ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters OUT subcases by their name\n",0x23);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -r,   --reporters=<filters>           ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"reporters to use (console is default)\n",0x26);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -o,   --out=<string>                  ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"output filename\n",0x10);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -ob,  --order-by=<string>             ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"how the tests should be ordered\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,
               "                                       <string> - [file/suite/name/rand/none]\n",
               0x4e);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -rs,  --rand-seed=<int>               ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"seed for random ordering\n",0x19);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -f,   --first=<int>                   ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"the first test passing the filters to\n",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,
               "                                       execute - for range-based execution\n",0x4b);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -l,   --last=<int>                    ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"the last test passing the filters to\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,
               "                                       execute - for range-based execution\n",0x4b);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -aa,  --abort-after=<int>             ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"stop after <int> failed assertions\n",0x23);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -scfl,--subcase-filter-levels=<int>   ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"apply filters for the first <int> levels\n",0x29);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n[doctest] ",0xb);
    Color::operator<<(poVar3,None);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->s,"Bool options - can be used like flags and true is assumed. Available:\n\n",
               0x47);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -s,   --success=<bool>                ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"include successful assertions in output\n",0x28);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -cs,  --case-sensitive=<bool>         ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"filters being treated as case sensitive\n",0x28);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -e,   --exit=<bool>                   ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"exits after the tests finish\n",0x1d)
    ;
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -d,   --duration=<bool>               ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"prints the time duration of each test\n",0x26);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -m,   --minimal=<bool>                ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"minimal console output (only failures)\n",0x27);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -q,   --quiet=<bool>                  ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"no console output\n",0x12);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -nt,  --no-throw=<bool>               ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"skips exceptions-related assert checks\n",0x27);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -ne,  --no-exitcode=<bool>            ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"returns (or exits) always with success\n",0x27);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -nr,  --no-run=<bool>                 ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"skips all runtime doctest operations\n",0x25);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -ni,  --no-intro=<bool>               ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"omit the framework intro in the output\n",0x27);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -nv,  --no-version=<bool>             ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"omit the framework version in the output\n",0x29);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -nc,  --no-colors=<bool>              ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"disables colors in output\n",0x1a);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -fc,  --force-colors=<bool>           ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"use colors even when not in a tty\n",0x22);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -nb,  --no-breaks=<bool>              ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"disables breakpoints in debuggers\n",0x22);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -ns,  --no-skip=<bool>                ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"don\'t skip test cases marked as skip\n",0x25);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -gfl, --gnu-file-line=<bool>          ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,":n: vs (n): for line numbers in output\n",0x27);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -npf, --no-path-filenames=<bool>      ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"only filenames and no paths in output\n",0x26);
    poVar3 = this->s;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," -nln, --no-line-numbers=<bool>        ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"0 instead of real line numbers in output\n",0x29);
    poVar3 = this->s;
    Color::operator<<(poVar3,Cyan);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n[doctest] ",0xb);
    Color::operator<<(poVar3,None);
    poVar3 = this->s;
    pcVar6 = "for more information visit the project documentation\n\n";
    lVar4 = 0x36;
  }
  else {
    if (pCVar1->list_reporters == true) {
      printVersion((ConsoleReporter *)this->s);
      getListeners();
      printRegisteredReporters::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&getListeners::data,"listeners");
      getReporters();
      printRegisteredReporters::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&getReporters::data,"reporters");
      return;
    }
    if ((pCVar1->count == false) && ((pCVar1->list_test_cases & 1U) == 0)) {
      if (pCVar1->list_test_suites != true) {
        return;
      }
      poVar3 = this->s;
      Color::operator<<(poVar3,Cyan);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
      Color::operator<<(poVar3,None);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"listing all test suites\n",0x18);
      separator_to_stream((ConsoleReporter *)this->s);
      if (in->num_data != 0) {
        uVar5 = 0;
        do {
          poVar3 = this->s;
          Color::operator<<(poVar3,None);
          pcVar6 = in->data[uVar5]->m_test_suite;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
          }
          else {
            sVar2 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          uVar5 = uVar5 + 1;
        } while (uVar5 < in->num_data);
      }
      separator_to_stream((ConsoleReporter *)this->s);
      poVar3 = this->s;
      Color::operator<<(poVar3,Cyan);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
      Color::operator<<(poVar3,None);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"unskipped test cases passing the current filters: ",0x32);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      pcVar6 = "\n";
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      poVar3 = this->s;
      Color::operator<<(poVar3,Cyan);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
      Color::operator<<(poVar3,None);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"test suites with unskipped test cases passing the current filters: ",0x43);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      lVar4 = 1;
    }
    else {
      if ((pCVar1->list_test_cases & 1U) != 0) {
        poVar3 = this->s;
        Color::operator<<(poVar3,Cyan);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
        Color::operator<<(poVar3,None);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"listing all test case names\n",0x1c);
        poVar3 = this->s;
        Color::operator<<(poVar3,Yellow);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,
                   "===============================================================================\n"
                   ,0x50);
      }
      if (in->num_data != 0) {
        uVar5 = 0;
        do {
          poVar3 = this->s;
          Color::operator<<(poVar3,None);
          pcVar6 = in->data[uVar5]->m_name;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
          }
          else {
            sVar2 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          uVar5 = uVar5 + 1;
        } while (uVar5 < in->num_data);
      }
      poVar3 = this->s;
      Color::operator<<(poVar3,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,
                 "===============================================================================\n"
                 ,0x50);
      poVar3 = this->s;
      Color::operator<<(poVar3,Cyan);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
      Color::operator<<(poVar3,None);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"unskipped test cases passing the current filters: ",0x32);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      pcVar6 = "\n";
      lVar4 = 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar4);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            if(opt.version) {
                printVersion();
            } else if(opt.help) {
                printHelp();
            } else if(opt.list_reporters) {
                printRegisteredReporters();
            } else if(opt.count || opt.list_test_cases) {
                if(opt.list_test_cases) {
                    s << Color::Cyan << "[doctest] " << Color::None
                      << "listing all test case names\n";
                    separator_to_stream();
                }

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_name << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";

            } else if(opt.list_test_suites) {
                s << Color::Cyan << "[doctest] " << Color::None << "listing all test suites\n";
                separator_to_stream();

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_test_suite << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";
                s << Color::Cyan << "[doctest] " << Color::None
                  << "test suites with unskipped test cases passing the current filters: "
                  << g_cs->numTestSuitesPassingFilters << "\n";
            }
        }